

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpFormat.h
# Opt level: O2

void __thiscall brynet::net::HttpResponse::setBody(HttpResponse *this,string *body)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::_M_assign((string *)&this->mBody);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Content-Length",&local_51)
  ;
  std::__cxx11::to_string(&local_50,body->_M_string_length);
  addHeadValue(this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void        setBody(const std::string& body)
            {
                mBody = body;
                addHeadValue("Content-Length", std::to_string(body.size()));
            }